

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall
cppforth::Forth::setSourceVariables(Forth *this,Cell Source,Cell sourceSize,Cell sourceMoreIn)

{
  Cell sourceMoreIn_local;
  Cell sourceSize_local;
  Cell Source_local;
  Forth *this_local;
  
  setSourceAddress(this,Source);
  setSourceBufferSize(this,sourceSize);
  setSourceBufferOffset(this,sourceMoreIn);
  return;
}

Assistant:

void setSourceVariables(Cell Source, Cell sourceSize, Cell sourceMoreIn) {
			setSourceAddress(Source);
			setSourceBufferSize(sourceSize);
			setSourceBufferOffset(sourceMoreIn);
		}